

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O2

int resampler_min_filled(resampler *r)

{
  byte bVar1;
  
  bVar1 = r->quality - 2;
  if (bVar1 < 4) {
    return *(int *)(&DAT_0060a540 + (ulong)bVar1 * 4);
  }
  return 1;
}

Assistant:

static int resampler_min_filled(resampler *r)
{
    switch (r->quality)
    {
    default:
    case RESAMPLER_QUALITY_ZOH:
    case RESAMPLER_QUALITY_BLEP:
        return 1;
            
    case RESAMPLER_QUALITY_LINEAR:
    case RESAMPLER_QUALITY_BLAM:
        return 2;
            
    case RESAMPLER_QUALITY_CUBIC:
        return 4;
            
    case RESAMPLER_QUALITY_SINC:
        return SINC_WIDTH * 2;
    }
}